

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.hpp
# Opt level: O2

void __thiscall
TasOptimization::ParticleSwarmState::setParticlePositions
          (ParticleSwarmState *this,vector<double,_std::allocator<double>_> *pp)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"ParticleSwarmState::setParticlePositions",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"particle position",&local_52);
  checkVarSize(&local_30,&local_50,
               (int)((ulong)((long)(pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                   .super__Vector_impl_data._M_finish -
                            (long)(pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start) >> 3),
               this->num_particles * this->num_dimensions);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::vector<double,_std::allocator<double>_>::operator=(&this->particle_positions,pp);
  this->positions_initialized = true;
  return;
}

Assistant:

void setParticlePositions(const std::vector<double> &pp) {
        checkVarSize("ParticleSwarmState::setParticlePositions", "particle position", pp.size(), num_dimensions * num_particles);
        particle_positions = pp;
        positions_initialized = true;
    }